

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Complete_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Repair_Complete_PDU::Decode
          (Repair_Complete_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1b < iVar2 + (uint)KVar1) {
    Logistics_Header::Decode(&this->super_Logistics_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Repair);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Repair_Complete_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < REPAIR_COMPLETE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );
    stream >> m_ui16Repair
           >> m_ui16Padding;
}